

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O1

int bursttraverseA(TRIE_conflict *node,string *strings,int pos,unsigned_short deep)

{
  uint uVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int depth;
  int iVar6;
  undefined6 in_register_0000000a;
  uint uVar7;
  char **__ptr;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  depth = (int)CONCAT62(in_register_0000000a,deep) + 1;
  lVar8 = 0;
  do {
    uVar1 = node->counts[lVar8];
    iVar3 = pos;
    if ((ulong)uVar1 != 0) {
      if (uVar1 == 0xffffffff) {
        iVar3 = bursttraverseA((TRIE_conflict *)node->ptrs[lVar8],strings,pos,(unsigned_short)depth)
        ;
      }
      else if (lVar8 == 0) {
        iVar6 = -((int)uVar1 >> 0x1f);
        iVar4 = (int)uVar1 / 0x1fff + ((int)uVar1 >> 0x1f);
        uVar7 = iVar4 + iVar6 + 1U & 0xffff;
        if (uVar7 != 0) {
          __ptr = node->ptrs[0];
          uVar9 = 1;
          do {
            uVar5 = 0x1fff;
            if (uVar9 == uVar7) {
              uVar5 = uVar1 + (iVar4 + iVar6) * -0x1fff & 0xffff;
            }
            if (uVar5 == 0) {
              uVar10 = 0;
            }
            else {
              uVar10 = 0;
              do {
                strings[(long)pos + uVar10] = (string)__ptr[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar5 != uVar10);
              pos = pos + (int)uVar10;
            }
            ppcVar2 = (char **)__ptr[uVar10];
            free(__ptr);
            bVar11 = uVar9 != uVar7;
            __ptr = ppcVar2;
            iVar3 = pos;
            uVar9 = uVar9 + 1;
          } while (bVar11);
        }
      }
      else {
        if (0 < (int)uVar1) {
          uVar10 = 0;
          do {
            strings[(long)pos + uVar10] = (string)node->ptrs[lVar8][uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
          iVar3 = (int)uVar10 + pos;
        }
        free(node->ptrs[lVar8]);
        if (1 < (int)uVar1) {
          if ((int)uVar1 < 0x14) {
            inssort(strings + pos,iVar3 - pos,depth);
          }
          else {
            mkqsort(strings + pos,iVar3 - pos,depth);
          }
        }
      }
    }
    pos = iVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x100);
  free(node);
  return pos;
}

Assistant:

static int
bursttraverseA(TRIE *node, string strings[], int pos, unsigned short deep)
{
    int i, j, k; 
    int off = 0;
    unsigned short no_of_buckets=0, no_elements_in_last_bucket=0, no_elements_in_bucket=0; 
    char **nullbucket, **headbucket;
    int count;

    for( i=0 ; i < ALPHABET; i++)
    {
        count = node->counts[i];

        if( !++count )
        {
            pos = bursttraverseA((TRIE *) node->ptrs[i], strings, pos, deep+1);
        }
        else if (--count)
        {
            if(i==0)
            {
                no_of_buckets = (count/THRESHOLDMINUSONE) + 1;
                no_elements_in_last_bucket = count % THRESHOLDMINUSONE;
                nullbucket = node->ptrs[i];
                headbucket = node->ptrs[i];
                off=pos;

                /* traverse all arrays in the bucket */
                for (k=1; k <= no_of_buckets; k++)
                {
                    if(k==no_of_buckets)
                        no_elements_in_bucket = no_elements_in_last_bucket;
                    else
                        no_elements_in_bucket = THRESHOLDMINUSONE;

                    /* traverse all elements in each bucket */
                    for (j=0; j < no_elements_in_bucket ; j++, off++) 
                    {
			strings[off] = (unsigned char*) nullbucket[j];
                    }
                    nullbucket = (char **) nullbucket[j];
                    free(headbucket);
                    headbucket = nullbucket;
                }
            }
            else
            {
                for( j=0, off=pos ; j < count ; j++, off++)
                    strings[off] = (unsigned char*) node->ptrs[i][j];

                free( node->ptrs[i] );

                if (count > 1)
                {
                    if (count < INSERTBREAK)
                        inssort( strings+pos, off-pos, deep + 1);  
                    else
                        mkqsort( strings+pos, off-pos, deep + 1);
                }
            }
            pos = off;
        }
    }
    free(node);
    return pos; 
}